

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

void __thiscall Assimp::FBXExporter::WriteHeaderExtension(FBXExporter *this)

{
  size_t i;
  tm *ptVar1;
  ostream *poVar2;
  ulong uVar3;
  allocator<char> local_379;
  string local_378;
  StreamWriterLE outstream;
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_308;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_2f8;
  stringstream creator;
  ostream local_2d0 [376];
  Node CreationTimeStamp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  time_t rawtime;
  Node n;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&creator,"FBXHeaderExtension",(allocator<char> *)&CreationTimeStamp);
  FBX::Node::Node(&n,(string *)&creator);
  std::__cxx11::string::~string((string *)&creator);
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_308,
             &(this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>);
  StreamWriter<false,_false>::StreamWriter
            (&outstream,(shared_ptr<Assimp::IOStream> *)&local_308,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_308._M_refcount);
  FBX::Node::Begin(&n,&outstream,this->binary,0);
  FBX::Node::EndProperties(&n,&outstream,this->binary,0,0);
  FBX::Node::BeginChildren(&n,&outstream,this->binary,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&creator,"FBXHeaderVersion",(allocator<char> *)&CreationTimeStamp);
  FBX::Node::WritePropertyNode<int>((string *)&creator,0x3eb,&outstream,this->binary,1);
  std::__cxx11::string::~string((string *)&creator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&creator,"FBXVersion",(allocator<char> *)&CreationTimeStamp);
  FBX::Node::WritePropertyNode<int>((string *)&creator,0x1d4c,&outstream,this->binary,1);
  std::__cxx11::string::~string((string *)&creator);
  if (this->binary == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&creator,"EncryptionType",(allocator<char> *)&CreationTimeStamp);
    FBX::Node::WritePropertyNode<int>((string *)&creator,0,&outstream,this->binary,1);
    std::__cxx11::string::~string((string *)&creator);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&creator,"CreationTimeStamp",(allocator<char> *)&local_378);
  FBX::Node::Node(&CreationTimeStamp,(string *)&creator);
  std::__cxx11::string::~string((string *)&creator);
  time(&rawtime);
  ptVar1 = localtime(&rawtime);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&creator,"Version",(allocator<char> *)&local_378);
  FBX::Node::AddChild<int>(&CreationTimeStamp,(string *)&creator,1000);
  std::__cxx11::string::~string((string *)&creator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&creator,"Year",(allocator<char> *)&local_378);
  FBX::Node::AddChild<int>(&CreationTimeStamp,(string *)&creator,ptVar1->tm_year + 0x76c);
  std::__cxx11::string::~string((string *)&creator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&creator,"Month",(allocator<char> *)&local_378);
  FBX::Node::AddChild<int>(&CreationTimeStamp,(string *)&creator,ptVar1->tm_mon + 1);
  std::__cxx11::string::~string((string *)&creator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&creator,"Day",(allocator<char> *)&local_378);
  FBX::Node::AddChild<int>(&CreationTimeStamp,(string *)&creator,ptVar1->tm_mday);
  std::__cxx11::string::~string((string *)&creator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&creator,"Hour",(allocator<char> *)&local_378);
  FBX::Node::AddChild<int>(&CreationTimeStamp,(string *)&creator,ptVar1->tm_hour);
  std::__cxx11::string::~string((string *)&creator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&creator,"Minute",(allocator<char> *)&local_378);
  FBX::Node::AddChild<int>(&CreationTimeStamp,(string *)&creator,ptVar1->tm_min);
  std::__cxx11::string::~string((string *)&creator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&creator,"Second",(allocator<char> *)&local_378);
  FBX::Node::AddChild<int>(&CreationTimeStamp,(string *)&creator,ptVar1->tm_sec);
  std::__cxx11::string::~string((string *)&creator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&creator,"Millisecond",(allocator<char> *)&local_378);
  FBX::Node::AddChild<int>(&CreationTimeStamp,(string *)&creator,0);
  std::__cxx11::string::~string((string *)&creator);
  FBX::Node::Dump(&CreationTimeStamp,&outstream,this->binary,1);
  std::__cxx11::stringstream::stringstream((stringstream *)&creator);
  poVar2 = std::operator<<(local_2d0,"Open Asset Import Library (Assimp) ");
  aiGetVersionMajor();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,".");
  aiGetVersionMinor();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,".");
  aiGetVersionRevision();
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"Creator",(allocator<char> *)&raw);
  std::__cxx11::stringbuf::str();
  FBX::Node::WritePropertyNode<std::__cxx11::string>(&local_378,&local_a8,&outstream,this->binary,1)
  ;
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_378);
  FBX::Node::End(&n,&outstream,this->binary,0,true);
  if (this->binary != false) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&raw,DAT_00830748,(allocator_type *)&local_378);
    for (uVar3 = 0; uVar3 < DAT_00830748; uVar3 = uVar3 + 1) {
      raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = *(uchar *)(FBX::GENERIC_FILEID_abi_cxx11_ + uVar3);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"FileId",&local_379);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2f8,&raw);
    FBX::Node::WritePropertyNode<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&local_378,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2f8,
               &outstream,this->binary,0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_2f8);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"CreationTime",&local_379);
    std::__cxx11::string::string((string *)&local_c8,(string *)FBX::GENERIC_CTIME_abi_cxx11_);
    FBX::Node::WritePropertyNode<std::__cxx11::string>
              (&local_378,&local_c8,&outstream,this->binary,0);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"Creator",&local_379);
    std::__cxx11::stringbuf::str();
    FBX::Node::WritePropertyNode<std::__cxx11::string>
              (&local_378,&local_e8,&outstream,this->binary,0);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_378);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&creator);
  FBX::Node::~Node(&CreationTimeStamp);
  StreamWriter<false,_false>::~StreamWriter(&outstream);
  FBX::Node::~Node(&n);
  return;
}

Assistant:

void FBXExporter::WriteHeaderExtension ()
{
    if (!binary) {
        // no title, follows directly from the top comment
    }
    FBX::Node n("FBXHeaderExtension");
    StreamWriterLE outstream(outfile);
    int indent = 0;

    // begin node
    n.Begin(outstream, binary, indent);

    // write properties
    // (none)

    // finish properties
    n.EndProperties(outstream, binary, indent, 0);

    // begin children
    n.BeginChildren(outstream, binary, indent);

    indent = 1;

    // write child nodes
    FBX::Node::WritePropertyNode(
        "FBXHeaderVersion", int32_t(1003), outstream, binary, indent
    );
    FBX::Node::WritePropertyNode(
        "FBXVersion", int32_t(EXPORT_VERSION_INT), outstream, binary, indent
    );
    if (binary) {
        FBX::Node::WritePropertyNode(
            "EncryptionType", int32_t(0), outstream, binary, indent
        );
    }

    FBX::Node CreationTimeStamp("CreationTimeStamp");
    time_t rawtime;
    time(&rawtime);
    struct tm * now = localtime(&rawtime);
    CreationTimeStamp.AddChild("Version", int32_t(1000));
    CreationTimeStamp.AddChild("Year", int32_t(now->tm_year + 1900));
    CreationTimeStamp.AddChild("Month", int32_t(now->tm_mon + 1));
    CreationTimeStamp.AddChild("Day", int32_t(now->tm_mday));
    CreationTimeStamp.AddChild("Hour", int32_t(now->tm_hour));
    CreationTimeStamp.AddChild("Minute", int32_t(now->tm_min));
    CreationTimeStamp.AddChild("Second", int32_t(now->tm_sec));
    CreationTimeStamp.AddChild("Millisecond", int32_t(0));
    CreationTimeStamp.Dump(outstream, binary, indent);

    std::stringstream creator;
    creator << "Open Asset Import Library (Assimp) " << aiGetVersionMajor()
            << "." << aiGetVersionMinor() << "." << aiGetVersionRevision();
    FBX::Node::WritePropertyNode(
        "Creator", creator.str(), outstream, binary, indent
    );

    //FBX::Node sceneinfo("SceneInfo");
    //sceneinfo.AddProperty("GlobalInfo" + FBX::SEPARATOR + "SceneInfo");
    // not sure if any of this is actually needed,
    // so just write an empty node for now.
    //sceneinfo.Dump(outstream, binary, indent);

    indent = 0;

    // finish node
    n.End(outstream, binary, indent, true);

    // that's it for FBXHeaderExtension...
    if (!binary) { return; }

    // but binary files also need top-level FileID, CreationTime, Creator:
    std::vector<uint8_t> raw(GENERIC_FILEID.size());
    for (size_t i = 0; i < GENERIC_FILEID.size(); ++i) {
        raw[i] = uint8_t(GENERIC_FILEID[i]);
    }
    FBX::Node::WritePropertyNode(
        "FileId", raw, outstream, binary, indent
    );
    FBX::Node::WritePropertyNode(
        "CreationTime", GENERIC_CTIME, outstream, binary, indent
    );
    FBX::Node::WritePropertyNode(
        "Creator", creator.str(), outstream, binary, indent
    );
}